

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

cbtVector3 PlaneProject(cbtPlane *plane,cbtVector3 *point)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  cbtVector3 cVar8;
  
  fVar1 = (plane->normal).m_floats[0];
  fVar2 = (plane->normal).m_floats[1];
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(point->m_floats[1] * fVar2)),
                           ZEXT416((uint)point->m_floats[0]),ZEXT416((uint)fVar1));
  fVar3 = (plane->normal).m_floats[2];
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)point->m_floats[2]),ZEXT416((uint)fVar3));
  fVar4 = auVar5._0_4_ + plane->dist;
  auVar5 = vinsertps_avx(ZEXT416((uint)(point->m_floats[0] - fVar1 * fVar4)),
                         ZEXT416((uint)(point->m_floats[1] - fVar2 * fVar4)),0x10);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar7._4_12_ = SUB1612(auVar6 << 0x40,4);
  auVar7._0_4_ = point->m_floats[2] - fVar3 * fVar4;
  cVar8.m_floats._0_8_ = auVar5._0_8_;
  cVar8.m_floats._8_8_ = auVar7._0_8_;
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}